

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::Array::Add(Array *this,char *idx,Variable *v)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_60;
  
  ppVar1 = (this->named).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (this->named).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0x30;
  lVar4 = 0;
  do {
    lVar5 = lVar5 + -0x30;
    if ((((long)ppVar1 - (long)ppVar2) / 0x30 & 0xffffffffU) * 0x30 + lVar5 == 0) {
      std::__cxx11::string::string((string *)&local_80,idx,&local_81);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_60,&local_80,v);
      std::
      vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
      ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
                ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                  *)this,&local_60);
      goto LAB_0013cbb6;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->named).
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus
                            + lVar4),idx);
    lVar4 = lVar4 + 0x30;
  } while (!bVar3);
  ppVar1 = (this->named).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_80,idx,&local_81);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_60,&local_80,v);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::_M_insert_rval(&this->named,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
                    *)((long)ppVar1 - lVar5),&local_60);
LAB_0013cbb6:
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::~pair(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void LiteScript::Array::Add(const char *idx, const Variable &v) {
    for (unsigned int i = 0, sz = this->named.size(); i < sz; i++) {
        if (this->named[i].first == idx) {
            this->named.emplace(this->named.begin() + i, std::pair<std::string, Variable>({std::string(idx), v}));
            return;
        }
    }
    this->named.push_back({ std::string(idx), v });
}